

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

bool __thiscall
wasm::WasmBinaryBuilder::maybeVisitStructNew(WasmBinaryBuilder *this,Expression **out,uint32_t code)

{
  pointer pFVar1;
  pointer pFVar2;
  bool bVar3;
  Struct *pSVar4;
  Expression *pEVar5;
  StructNew *pSVar6;
  ulong uVar7;
  ulong uVar8;
  size_type __new_size;
  Builder local_70;
  Expression **local_68;
  HeapType local_60;
  HeapType heapType;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> operands;
  
  if (code - 7 < 2) {
    local_68 = out;
    local_60 = getIndexedHeapType(this);
    heapType.id = 0;
    if (code == 7) {
      pSVar4 = HeapType::getStruct(&local_60);
      pFVar1 = (pSVar4->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pFVar2 = (pSVar4->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      __new_size = (long)pFVar2 - (long)pFVar1 >> 4;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::resize
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&heapType,
                 __new_size);
      if (pFVar2 != pFVar1) {
        uVar7 = 0;
        uVar8 = 1;
        do {
          pEVar5 = popNonVoidExpression(this);
          *(Expression **)(heapType.id + __new_size * 8 + ~uVar7 * 8) = pEVar5;
          bVar3 = uVar8 < __new_size;
          uVar7 = uVar8;
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (bVar3);
      }
    }
    local_70.wasm = this->wasm;
    pSVar6 = Builder::
             makeStructNew<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                       (&local_70,local_60,
                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&heapType
                       );
    *local_68 = (Expression *)pSVar6;
    if (heapType.id != 0) {
      operator_delete((void *)heapType.id,-heapType.id);
    }
  }
  return code - 7 < 2;
}

Assistant:

bool WasmBinaryBuilder::maybeVisitStructNew(Expression*& out, uint32_t code) {
  if (code == BinaryConsts::StructNew ||
      code == BinaryConsts::StructNewDefault) {
    auto heapType = getIndexedHeapType();
    std::vector<Expression*> operands;
    if (code == BinaryConsts::StructNew) {
      auto numOperands = heapType.getStruct().fields.size();
      operands.resize(numOperands);
      for (Index i = 0; i < numOperands; i++) {
        operands[numOperands - i - 1] = popNonVoidExpression();
      }
    }
    out = Builder(wasm).makeStructNew(heapType, operands);
    return true;
  }
  return false;
}